

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::Parser::LocationRecorder::StartAt(LocationRecorder *this,Token *token)

{
  int iVar1;
  Location *pLVar2;
  LogMessage *pLVar3;
  LogFinisher local_a1;
  LogMessage local_a0;
  LogMessage local_68;
  
  pLVar2 = this->location_;
  iVar1 = token->line;
  if ((pLVar2->span_).current_size_ < 1) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
               ,0x271);
    pLVar3 = internal::LogMessage::operator<<(&local_68,"CHECK failed: (index) < (size()): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_a0,pLVar3);
    internal::LogMessage::~LogMessage(&local_68);
  }
  *(pLVar2->span_).elements_ = iVar1;
  pLVar2 = this->location_;
  iVar1 = token->column;
  if ((pLVar2->span_).current_size_ < 2) {
    internal::LogMessage::LogMessage
              (&local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
               ,0x271);
    pLVar3 = internal::LogMessage::operator<<(&local_a0,"CHECK failed: (index) < (size()): ");
    internal::LogFinisher::operator=(&local_a1,pLVar3);
    internal::LogMessage::~LogMessage(&local_a0);
  }
  (pLVar2->span_).elements_[1] = iVar1;
  return;
}

Assistant:

void Parser::LocationRecorder::StartAt(const io::Tokenizer::Token& token) {
  location_->set_span(0, token.line);
  location_->set_span(1, token.column);
}